

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O0

void __thiscall wasm::PostEmscripten::removeEmJsExports(PostEmscripten *this,Module *module)

{
  Module *this_00;
  bool bVar1;
  reference this_01;
  Name *pNVar2;
  Export *exp;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Export,_std::allocator<wasm::Export>_> *__range2;
  EmJsWalker walker;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  Module *pMStack_18;
  bool sideModule;
  Module *module_local;
  PostEmscripten *this_local;
  
  pMStack_18 = module;
  module_local = (Module *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"post-emscripten-side-module",&local_41);
  bVar1 = Pass::hasArgument(&this->super_Pass,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_19 = bVar1;
  anon_unknown_0::EmJsWalker::EmJsWalker((EmJsWalker *)&__range2,bVar1);
  Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  ::walkModule((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
                *)&__range2,pMStack_18);
  __end2 = std::vector<wasm::Export,_std::allocator<wasm::Export>_>::begin
                     ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&walker.sideModule);
  exp = (Export *)
        std::vector<wasm::Export,_std::allocator<wasm::Export>_>::end
                  ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&walker.sideModule);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>
                                *)&exp);
    if (!bVar1) {
      anon_unknown_0::EmJsWalker::~EmJsWalker((EmJsWalker *)&__range2);
      return;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>
              ::operator*(&__end2);
    this_00 = pMStack_18;
    if (this_01->kind == Function) {
      pNVar2 = Export::getInternalName(this_01);
      Module::removeFunction(this_00,(Name)(pNVar2->super_IString).str);
    }
    else {
      if (this_01->kind != Global) {
        __assert_fail("exp.kind == ExternalKind::Global",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp"
                      ,0xf7,"void wasm::PostEmscripten::removeEmJsExports(Module &)");
      }
      pNVar2 = Export::getInternalName(this_01);
      Module::removeGlobal(this_00,(Name)(pNVar2->super_IString).str);
    }
    Module::removeExport(pMStack_18,(Name)(this_01->name).super_IString.str);
    __gnu_cxx::
    __normal_iterator<wasm::Export_*,_std::vector<wasm::Export,_std::allocator<wasm::Export>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

void removeEmJsExports(Module& module) {
    auto sideModule = hasArgument("post-emscripten-side-module");
    EmJsWalker walker(sideModule);
    walker.walkModule(&module);
    for (Export& exp : walker.toRemove) {
      if (exp.kind == ExternalKind::Function) {
        module.removeFunction(*exp.getInternalName());
      } else {
        assert(exp.kind == ExternalKind::Global);
        module.removeGlobal(*exp.getInternalName());
      }
      module.removeExport(exp.name);
    }
  }